

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

void cdef_filter_16_3_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 *puVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  v128 row1_1;
  v128 row0_1;
  int i_1;
  uint16_t *dst16_1;
  uint8_t *dst8_1;
  int local_6f4;
  int local_684;
  undefined8 local_5b8;
  undefined8 local_578;
  undefined8 local_538;
  undefined8 local_4f8;
  ulong uStack_2d0;
  int dir_local;
  int sec_strength_local;
  int pri_strength_local;
  uint16_t *in_local;
  int dstride_local;
  void *dest_local;
  v128 res_128;
  v128 row1;
  v128 row0;
  int i;
  uint16_t *dst16;
  uint8_t *dst8;
  
  if (block_width == 8) {
    for (local_6f4 = 0; local_6f4 < block_height; local_6f4 = local_6f4 + 2) {
      uVar2 = *(undefined8 *)(in + local_6f4 * 0x90 + 4);
      uVar3 = *(undefined8 *)(in + (local_6f4 + 1) * 0x90);
      uVar4 = *(undefined8 *)(in + (local_6f4 + 1) * 0x90 + 4);
      puVar8 = (undefined8 *)((long)dest + (long)(local_6f4 * dstride) * 2);
      *puVar8 = *(undefined8 *)(in + local_6f4 * 0x90);
      puVar8[1] = uVar2;
      puVar8 = (undefined8 *)((long)dest + (long)((local_6f4 + 1) * dstride) * 2);
      *puVar8 = uVar3;
      puVar8[1] = uVar4;
    }
  }
  else {
    for (local_684 = 0; local_684 < block_height; local_684 = local_684 + 4) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(in + (local_684 * 0x90 + 0x90));
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)(in + local_684 * 0x90);
      auVar10 = vpunpcklqdq_avx(auVar5,auVar10);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(in + (local_684 * 0x90 + 0x1b0));
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)(in + (local_684 * 0x90 + 0x120));
      auVar1 = vpunpcklqdq_avx(auVar9,auVar1);
      auVar9 = vpsrldq_avx(auVar10,8);
      local_4f8 = auVar9._0_8_;
      *(undefined8 *)((long)dest + (long)(local_684 * dstride) * 2) = local_4f8;
      uStack_2d0 = SUB168(ZEXT816(0),4);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uStack_2d0;
      auVar10 = vpunpcklqdq_avx(auVar10,auVar6 << 0x40);
      local_538 = auVar10._0_8_;
      *(undefined8 *)((long)dest + (long)((local_684 + 1) * dstride) * 2) = local_538;
      auVar10 = vpsrldq_avx(auVar1,8);
      local_578 = auVar10._0_8_;
      *(undefined8 *)((long)dest + (long)((local_684 + 2) * dstride) * 2) = local_578;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uStack_2d0;
      auVar10 = vpunpcklqdq_avx(auVar1,auVar7 << 0x40);
      local_5b8 = auVar10._0_8_;
      *(undefined8 *)((long)dest + (long)((local_684 + 3) * dstride) * 2) = local_5b8;
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_3)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  (void)pri_strength;
  (void)sec_strength;
  (void)dir;
  (void)pri_damping;
  (void)sec_damping;
  (void)coeff_shift;
  (void)block_width;
  if (block_width == 8) {
    copy_block_8xh(/*is_lowbd=*/0, dest, dstride, in, block_height);
  } else {
    copy_block_4xh(/*is_lowbd=*/0, dest, dstride, in, block_height);
  }
}